

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

stbi_uc * hdr_to_ldr(float *data,int x,int y,int comp)

{
  double dVar1;
  float local_40;
  float local_3c;
  float z_1;
  float z;
  stbi_uc *output;
  int n;
  int k;
  int i;
  int comp_local;
  int y_local;
  int x_local;
  float *data_local;
  
  data_local = (float *)malloc((long)(x * y * comp));
  if (data_local == (float *)0x0) {
    free(data);
    e("Out of memory");
    data_local = (float *)0x0;
  }
  else {
    output._0_4_ = comp;
    if ((comp & 1U) == 0) {
      output._0_4_ = comp + -1;
    }
    for (n = 0; n < x * y; n = n + 1) {
      for (output._4_4_ = 0; output._4_4_ < (int)output; output._4_4_ = output._4_4_ + 1) {
        dVar1 = pow((double)(data[n * comp + output._4_4_] * h2l_scale_i),(double)h2l_gamma_i);
        local_3c = (float)dVar1 * 255.0 + 0.5;
        if (local_3c < 0.0) {
          local_3c = 0.0;
        }
        if (255.0 < local_3c) {
          local_3c = 255.0;
        }
        *(char *)((long)data_local + (long)(n * comp + output._4_4_)) = (char)(int)local_3c;
      }
      if (output._4_4_ < comp) {
        local_40 = data[n * comp + output._4_4_] * 255.0 + 0.5;
        if (local_40 < 0.0) {
          local_40 = 0.0;
        }
        if (255.0 < local_40) {
          local_40 = 255.0;
        }
        *(char *)((long)data_local + (long)(n * comp + output._4_4_)) = (char)(int)local_40;
      }
    }
    free(data);
  }
  return (stbi_uc *)data_local;
}

Assistant:

static stbi_uc *hdr_to_ldr(float   *data, int x, int y, int comp)
{
   int i,k,n;
   stbi_uc *output = (stbi_uc *) malloc(x * y * comp);
   if (output == NULL) { free(data); return epuc("outofmem", "Out of memory"); }
   // compute number of non-alpha components
   if (comp & 1) n = comp; else n = comp-1;
   for (i=0; i < x*y; ++i) {
      for (k=0; k < n; ++k) {
         float z = (float) pow(data[i*comp+k]*h2l_scale_i, h2l_gamma_i) * 255 + 0.5f;
         if (z < 0) z = 0;
         if (z > 255) z = 255;
         output[i*comp + k] = float2int(z);
      }
      if (k < comp) {
         float z = data[i*comp+k] * 255 + 0.5f;
         if (z < 0) z = 0;
         if (z > 255) z = 255;
         output[i*comp + k] = float2int(z);
      }
   }
   free(data);
   return output;
}